

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_lib.c
# Opt level: O0

int evp_cipher_asn1_to_param_ex
              (EVP_CIPHER_CTX *c,ASN1_TYPE *type,evp_cipher_aead_asn1_params *asn1_params)

{
  EVP_CIPHER *cipher_00;
  int iVar1;
  unsigned_long uVar2;
  ASN1_TYPE *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int derl;
  uchar *der;
  OSSL_PARAM *p;
  OSSL_PARAM params [3];
  EVP_CIPHER *cipher;
  int ret;
  EVP_CIPHER_CTX *ctx;
  EVP_CIPHER_CTX *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  evp_cipher_aead_asn1_params *in_stack_fffffffffffffef8;
  ASN1_TYPE *in_stack_ffffffffffffff00;
  EVP_CIPHER_CTX *in_stack_ffffffffffffff08;
  undefined1 local_e8 [44];
  int local_bc;
  uchar *local_b8;
  EVP_CIPHER_CTX *local_b0;
  int local_1c;
  
  local_1c = -1;
  cipher_00 = in_RDI->cipher;
  if (cipher_00->get_asn1_parameters == (_func_int_EVP_CIPHER_CTX_ptr_ASN1_TYPE_ptr *)0x0) {
    uVar2 = EVP_CIPHER_get_flags(cipher_00);
    if ((uVar2 & 0x1000000) == 0) {
      in_stack_fffffffffffffeec = EVP_CIPHER_get_mode((EVP_CIPHER *)0x268cb0);
      if (in_stack_fffffffffffffeec == 6) {
        local_1c = evp_cipher_get_asn1_aead_params
                             (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
      }
      else {
        if ((in_stack_fffffffffffffeec != 7) && (in_stack_fffffffffffffeec != 0x10001)) {
          if (in_stack_fffffffffffffeec == 0x10002) {
            local_1c = 1;
            goto LAB_00268e54;
          }
          if (in_stack_fffffffffffffeec != 0x10003) {
            local_1c = EVP_CIPHER_get_asn1_iv((EVP_CIPHER_CTX *)in_RDI,in_RSI);
            goto LAB_00268e54;
          }
        }
        local_1c = -2;
      }
    }
    else if (cipher_00->prov == (OSSL_PROVIDER *)0x0) {
      local_1c = -2;
    }
    else {
      local_b0 = (EVP_CIPHER_CTX *)&stack0xffffffffffffff58;
      local_b8 = (uchar *)0x0;
      local_bc = 0xffffffff;
      local_bc = i2d_ASN1_TYPE(in_RSI,&local_b8);
      if (-1 < local_bc) {
        ctx = local_b0;
        local_b0 = (EVP_CIPHER_CTX *)local_b0->iv;
        OSSL_PARAM_construct_octet_string
                  (in_stack_fffffffffffffef0,
                   (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (size_t)in_stack_fffffffffffffee0);
        memcpy(ctx,local_e8,0x28);
        in_stack_fffffffffffffee0 = local_b0;
        OSSL_PARAM_construct_end();
        memcpy(in_stack_fffffffffffffee0,&stack0xfffffffffffffef0,0x28);
        iVar1 = EVP_CIPHER_CTX_set_params(ctx,(OSSL_PARAM *)0x268e1d);
        if (iVar1 != 0) {
          local_1c = 1;
        }
        CRYPTO_free(local_b8);
      }
    }
  }
  else {
    local_1c = (*cipher_00->get_asn1_parameters)(in_RDI,(ASN1_TYPE *)in_RSI);
  }
LAB_00268e54:
  if (local_1c == -2) {
    ERR_new();
    ERR_set_debug(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                  (char *)in_stack_fffffffffffffee0);
    ERR_set_error(6,0x6b,(char *)0x0);
  }
  else if (local_1c < 1) {
    ERR_new();
    ERR_set_debug(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                  (char *)in_stack_fffffffffffffee0);
    ERR_set_error(6,0x7a,(char *)0x0);
  }
  if (local_1c < -1) {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

int evp_cipher_asn1_to_param_ex(EVP_CIPHER_CTX *c, ASN1_TYPE *type,
                                evp_cipher_aead_asn1_params *asn1_params)
{
    int ret = -1;                /* Assume the worst */
    const EVP_CIPHER *cipher = c->cipher;

    /*
     * For legacy implementations, we detect custom AlgorithmIdentifier
     * parameter handling by checking if there the function pointer
     * cipher->get_asn1_parameters is set.  We know that this pointer
     * is NULL for provided implementations.
     *
     * Otherwise, for any implementation, we check the flag
     * EVP_CIPH_FLAG_CUSTOM_ASN1.  If it isn't set, we apply
     * default AI parameter creation.
     *
     * Otherwise, for provided implementations, we get the AI parameter
     * in DER encoded form from the implementation by requesting the
     * appropriate OSSL_PARAM and converting the result to a ASN1_TYPE.
     *
     * If none of the above applies, this operation is unsupported.
     */
    if (cipher->get_asn1_parameters != NULL) {
        ret = cipher->get_asn1_parameters(c, type);
    } else if ((EVP_CIPHER_get_flags(cipher) & EVP_CIPH_FLAG_CUSTOM_ASN1) == 0) {
        switch (EVP_CIPHER_get_mode(cipher)) {
        case EVP_CIPH_WRAP_MODE:
            ret = 1;
            break;

        case EVP_CIPH_GCM_MODE:
            ret = evp_cipher_get_asn1_aead_params(c, type, asn1_params);
            break;

        case EVP_CIPH_CCM_MODE:
        case EVP_CIPH_XTS_MODE:
        case EVP_CIPH_OCB_MODE:
            ret = -2;
            break;

        default:
            ret = EVP_CIPHER_get_asn1_iv(c, type);
        }
    } else if (cipher->prov != NULL) {
        OSSL_PARAM params[3], *p = params;
        unsigned char *der = NULL;
        int derl = -1;

        if ((derl = i2d_ASN1_TYPE(type, &der)) >= 0) {
            *p++ =
                OSSL_PARAM_construct_octet_string(
                        OSSL_CIPHER_PARAM_ALGORITHM_ID_PARAMS,
                        der, (size_t)derl);
            *p = OSSL_PARAM_construct_end();
            if (EVP_CIPHER_CTX_set_params(c, params))
                ret = 1;
            OPENSSL_free(der);
        }
    } else {
        ret = -2;
    }

    if (ret == -2)
        ERR_raise(ERR_LIB_EVP, EVP_R_UNSUPPORTED_CIPHER);
    else if (ret <= 0)
        ERR_raise(ERR_LIB_EVP, EVP_R_CIPHER_PARAMETER_ERROR);
    if (ret < -1)
        ret = -1;
    return ret;
}